

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCompiledEvalInternal
              (xmlXPathCompExprPtr comp,xmlXPathContextPtr ctxt,xmlXPathObjectPtr *resObjPtr,
              int toBool)

{
  xmlError *err;
  uint uVar1;
  int iVar2;
  xmlXPathParserContextPtr ctxt_00;
  xmlXPathObjectPtr *ppxVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (comp == (xmlXPathCompExprPtr)0x0) {
    return -1;
  }
  xmlInitParser();
  err = &ctxt->lastError;
  xmlResetError(err);
  ctxt_00 = (xmlXPathParserContextPtr)(*xmlMalloc)(0x58);
  if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
    if (ctxt == (xmlXPathContextPtr)0x0) {
      ctxt_00 = (xmlXPathParserContextPtr)0x0;
    }
    else {
      ctxt_00 = (xmlXPathParserContextPtr)0x0;
      xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,err);
    }
  }
  else {
    ctxt_00->value = (xmlXPathObjectPtr)0x0;
    ctxt_00->valueNr = 0;
    ctxt_00->valueMax = 0;
    *(undefined8 *)&ctxt_00->xptr = 0;
    ctxt_00->ancestor = (xmlNodePtr)0x0;
    ctxt_00->valueTab = (xmlXPathObjectPtr *)0x0;
    ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
    *(undefined8 *)&ctxt_00->error = 0;
    ctxt_00->context = (xmlXPathContextPtr)0x0;
    ctxt_00->cur = (xmlChar *)0x0;
    ctxt_00->base = (xmlChar *)0x0;
    *(undefined8 *)&ctxt_00->valueFrame = 0;
    ctxt_00->valueMax = 10;
    ppxVar3 = (xmlXPathObjectPtr *)(*xmlMalloc)(0x50);
    ctxt_00->valueTab = ppxVar3;
    if (ppxVar3 == (xmlXPathObjectPtr *)0x0) {
      (*xmlFree)(ctxt_00);
      if (ctxt == (xmlXPathContextPtr)0x0) {
        ctxt_00 = (xmlXPathParserContextPtr)0x0;
      }
      else {
        ctxt_00 = (xmlXPathParserContextPtr)0x0;
        xmlRaiseMemoryError(ctxt->error,(xmlGenericErrorFunc)0x0,ctxt->userData,0xc,err);
      }
    }
    else {
      ctxt_00->valueNr = 0;
      ctxt_00->value = (xmlXPathObjectPtr)0x0;
      ctxt_00->context = ctxt;
      ctxt_00->comp = comp;
    }
  }
  if (ctxt_00 == (xmlXPathParserContextPtr)0x0) {
    return -1;
  }
  iVar2 = xmlXPathRunEval(ctxt_00,toBool);
  if (ctxt_00->error == 0) {
    uVar1 = ctxt_00->valueNr;
    if (uVar1 == (toBool == 0)) {
      pxVar4 = (xmlXPathObjectPtr)0x0;
      if ((toBool == 0) && (0 < (int)uVar1)) {
        ctxt_00->valueNr = uVar1 - 1;
        if (uVar1 == 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar4 = ctxt_00->valueTab[(long)(int)uVar1 + -2];
        }
        ctxt_00->value = pxVar4;
        pxVar4 = ctxt_00->valueTab[(long)(int)uVar1 + -1];
        ctxt_00->valueTab[(long)(int)uVar1 + -1] = (xmlXPathObjectPtr)0x0;
      }
      goto LAB_001c4170;
    }
    xmlXPathErr(ctxt_00,0x17);
  }
  pxVar4 = (xmlXPathObjectPtr)0x0;
LAB_001c4170:
  if (resObjPtr == (xmlXPathObjectPtr *)0x0) {
    xmlXPathReleaseObject(ctxt,pxVar4);
  }
  else {
    *resObjPtr = pxVar4;
  }
  ctxt_00->comp = (xmlXPathCompExprPtr)0x0;
  xmlXPathFreeParserContext(ctxt_00);
  return iVar2;
}

Assistant:

static int
xmlXPathCompiledEvalInternal(xmlXPathCompExprPtr comp,
			     xmlXPathContextPtr ctxt,
			     xmlXPathObjectPtr *resObjPtr,
			     int toBool)
{
    xmlXPathParserContextPtr pctxt;
    xmlXPathObjectPtr resObj = NULL;
    int res;

    if (comp == NULL)
	return(-1);
    xmlInitParser();

    xmlResetError(&ctxt->lastError);

    pctxt = xmlXPathCompParserContext(comp, ctxt);
    if (pctxt == NULL)
        return(-1);
    res = xmlXPathRunEval(pctxt, toBool);

    if (pctxt->error == XPATH_EXPRESSION_OK) {
        if (pctxt->valueNr != ((toBool) ? 0 : 1))
            xmlXPathErr(pctxt, XPATH_STACK_ERROR);
        else if (!toBool)
            resObj = xmlXPathValuePop(pctxt);
    }

    if (resObjPtr)
        *resObjPtr = resObj;
    else
        xmlXPathReleaseObject(ctxt, resObj);

    pctxt->comp = NULL;
    xmlXPathFreeParserContext(pctxt);

    return(res);
}